

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s;
  type x2;
  int iVar1;
  int iVar2;
  uint uVar3;
  bool *pbVar4;
  size_t sVar5;
  ostream *poVar6;
  path *ppVar7;
  path *ppVar8;
  code *pcVar9;
  int iVar10;
  big_int32_buf_t magic;
  path replace;
  path outFilename;
  path inFilename;
  ofstream outfile;
  ifstream in;
  char local_4b5;
  undefined4 local_4b4;
  path local_4b0;
  path local_488;
  path local_460;
  undefined1 local_438 [248];
  ios_base local_340 [264];
  long local_238 [4];
  byte abStack_218 [488];
  
  std::filesystem::__cxx11::path::path(&local_460);
  std::filesystem::__cxx11::path::path(&local_488);
  ppVar7 = &local_4b0;
  std::filesystem::__cxx11::path::path(ppVar7);
  iVar2 = (int)ppVar7;
  if (1 < argc) {
    iVar10 = 1;
    do {
      ppVar7 = (path *)argv[iVar10];
      ppVar8 = ppVar7;
      iVar1 = strcmp((char *)ppVar7,"-bup-parts");
      iVar2 = (int)ppVar8;
      if (iVar1 == 0) {
        pbVar4 = &SAVE_BUP_AS_PARTS;
LAB_001155aa:
        *pbVar4 = true;
      }
      else {
        ppVar8 = ppVar7;
        iVar2 = strcmp((char *)ppVar7,"-debug-images");
        if (iVar2 == 0) {
          iVar10 = iVar10 + 1;
          if (argc <= iVar10) goto LAB_001158f6;
          iVar2 = 0x11e450;
          std::filesystem::__cxx11::path::operator=(&debugImagePath_abi_cxx11_,argv + iVar10);
          pbVar4 = &SHOULD_WRITE_DEBUG_IMAGES;
          goto LAB_001155aa;
        }
        iVar2 = strcmp((char *)ppVar7,"-replace");
        if (iVar2 == 0) {
          iVar10 = iVar10 + 1;
          ppVar8 = ppVar7;
          if (argc <= iVar10) goto LAB_001158f6;
          ppVar7 = &local_4b0;
          std::filesystem::__cxx11::path::operator=(ppVar7,argv + iVar10);
          iVar2 = (int)ppVar7;
        }
        else {
          ppVar8 = &local_460;
          if ((local_460._M_pathname._M_string_length != 0) &&
             (ppVar8 = &local_488, local_488._M_pathname._M_string_length != 0)) {
LAB_001158f6:
            iVar2 = (int)ppVar8;
            usage(iVar2,argv);
            goto LAB_001158fe;
          }
          std::filesystem::__cxx11::path::operator=(ppVar8,argv + iVar10);
          iVar2 = (int)ppVar8;
        }
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 < argc);
  }
  if ((local_460._M_pathname._M_string_length == 0) || (local_488._M_pathname._M_string_length == 0)
     ) {
LAB_001158fe:
    usage(iVar2,argv);
  }
  else {
    std::filesystem::__cxx11::path::operator=(&currentFileName_abi_cxx11_,&local_460);
    std::ifstream::ifstream(local_238,argv[1],_S_bin);
    if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
      std::istream::read((char *)local_238,(long)&local_4b4);
      std::istream::seekg((long)local_238,_S_beg);
      if (local_4b0._M_pathname._M_string_length != 0) {
        std::ofstream::ofstream(local_438,local_488._M_pathname._M_dataplus._M_p,_S_bin);
        uVar3 = local_4b4 >> 0x18 | (local_4b4 & 0xff0000) >> 8 | (local_4b4 & 0xff00) << 8 |
                local_4b4 << 0x18;
        if (uVar3 == 0x50494334) {
          iVar2 = replacePic((istream *)local_238,(ostream *)local_438,&local_4b0);
        }
        else if (uVar3 == 0x54584134) {
          iVar2 = replaceTxa((istream *)local_238,(ostream *)local_438,&local_4b0);
        }
        else {
          __s = argv[1];
          if (__s == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x11f418);
          }
          else {
            sVar5 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar5);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,": file type \'",0xd);
          local_4b5 = (char)local_4b4._0_1_;
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,&local_4b5,1);
          local_4b5 = (char)local_4b4._1_1_;
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_4b5,1);
          local_4b5 = (char)local_4b4._2_1_;
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_4b5,1);
          local_4b5 = local_4b4._3_1_;
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_4b5,1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,"\' unsupported by replace",0x18);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          iVar2 = 1;
          std::ostream::flush();
        }
        local_438._0_8_ = _VTT;
        *(undefined8 *)(local_438 + *(long *)(_VTT + -0x18)) = _iconv_open;
        std::filebuf::~filebuf((filebuf *)(local_438 + 8));
        std::ios_base::~ios_base(local_340);
        goto LAB_001158b7;
      }
      uVar3 = local_4b4 >> 0x18 | (local_4b4 & 0xff0000) >> 8 | (local_4b4 & 0xff00) << 8 |
              local_4b4 << 0x18;
      if ((int)uVar3 < 0x4d534b34) {
        if (uVar3 == 0x42555034) {
          pcVar9 = processBup;
        }
        else {
          if (uVar3 != 0x4d534b33) {
LAB_00115940:
            poVar6 = std::operator<<((ostream *)&std::cerr,argv[1]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,": unknown magic: \'",0x12);
            local_438[0] = local_4b4._0_1_;
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_438,1);
            local_438[0] = local_4b4._1_1_;
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_438,1);
            local_438[0] = local_4b4._2_1_;
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_438,1);
            local_438[0] = (ostream)local_4b4._3_1_;
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_438,1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\'",1);
            std::endl<char,std::char_traits<char>>(poVar6);
            goto LAB_00115936;
          }
          pcVar9 = processMsk3;
        }
      }
      else if (uVar3 == 0x4d534b34) {
        pcVar9 = processMsk4;
      }
      else if (uVar3 == 0x50494334) {
        pcVar9 = processPic;
      }
      else {
        if (uVar3 != 0x54584134) goto LAB_00115940;
        pcVar9 = processTxa;
      }
      std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
                ((path *)local_438,argv + 2,auto_format);
      iVar2 = (*pcVar9)(local_238,local_438);
      std::filesystem::__cxx11::path::~path((path *)local_438);
LAB_001158b7:
      std::ifstream::~ifstream(local_238);
      std::filesystem::__cxx11::path::~path(&local_4b0);
      std::filesystem::__cxx11::path::~path(&local_488);
      std::filesystem::__cxx11::path::~path(&local_460);
      return iVar2;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Failed to open file ",0x14);
  poVar6 = std::operator<<((ostream *)&std::cerr,argv[1]);
  std::endl<char,std::char_traits<char>>(poVar6);
LAB_00115936:
  exit(1);
}

Assistant:

int main(int argc, const char **argv) {
	fs::path inFilename, outFilename, replace;
#ifdef _WIN32
	int wargc;
	LPWSTR* wargv = CommandLineToArgvW(GetCommandLineW(), &wargc);
	LPWSTR* arg_fnames = wargv;
#else
	const char** arg_fnames = argv;
#endif
	for (int i = 1; i < argc; i++) {
		if (0 == strcmp(argv[i], "-bup-parts")) {
			SAVE_BUP_AS_PARTS = true;
		}
		else if (0 == strcmp(argv[i], "-debug-images")) {
			i++;
			if (i >= argc) {
				usage(argc, argv);
			}
			debugImagePath = arg_fnames[i];
			SHOULD_WRITE_DEBUG_IMAGES = true;
		}
		else if (0 == strcmp(argv[i], "-replace")) {
			i++;
			if (i >= argc) {
				usage(argc, argv);
			}
			replace = arg_fnames[i];
		}
		else if (inFilename.empty()) {
			inFilename = arg_fnames[i];
		}
		else if (outFilename.empty()) {
			outFilename = arg_fnames[i];
		}
		else {
			usage(argc, argv);
		}
	}
	if (inFilename.empty() || outFilename.empty()) {
		usage(argc,argv);
	}
	currentFileName = inFilename;

	std::ifstream in(argv[1], std::ios::binary);
	if (!in) {
		std::cerr << "Failed to open file " << argv[1] << std::endl;
		exit(EXIT_FAILURE);
	}

	boost::endian::big_int32_buf_t magic;
	
	in.read((char *)&magic, 4);
	in.seekg(0, in.beg);

	if (!replace.empty()) {
		fs::ofstream outfile(outFilename, std::ios::binary);
		switch (magic.value()) {
			case 'PIC4': return replacePic(in, outfile, replace);
			case 'TXA4': return replaceTxa(in, outfile, replace);
		}
		char *chars = (char *)&magic;
		std::cerr << argv[1] << ": file type '" << chars[0] << chars[1] << chars[2] << chars[3] << "' unsupported by replace" << std::endl;
		return EXIT_FAILURE;
	} else {
		int (*processFunction)(std::istream&, const fs::path&);
		switch (magic.value()) {
			case 'PIC4': processFunction = processPic; break;
			case 'BUP4': processFunction = processBup; break;
			case 'TXA4': processFunction = processTxa; break;
			case 'MSK3': processFunction = processMsk3; break;
			case 'MSK4': processFunction = processMsk4; break;
			default: {
				char *chars = (char *)&magic;
				std::cerr << argv[1] << ": unknown magic: '" << chars[0] << chars[1] << chars[2] << chars[3] << "'" << std::endl;
				exit(EXIT_FAILURE);
			}
		}
		return processFunction(in, argv[2]);
	}
}